

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

interresult __thiscall tetgenmesh::finddirection(tetgenmesh *this,triface *searchtet,point endpt)

{
  int iVar1;
  tetrahedron pa_00;
  point pc_00;
  unsigned_long uVar2;
  char cVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int s;
  int t1ver;
  double lori;
  double rori;
  double hori;
  anon_enum_32 nextmove;
  point pd;
  point pc;
  point pb;
  point pa;
  triface neightet;
  point endpt_local;
  triface *searchtet_local;
  tetgenmesh *this_local;
  
  neightet._8_8_ = endpt;
  triface::triface((triface *)&pa);
  pa_00 = (tetrahedron)org(this,searchtet);
  if (searchtet->tet[7] == (tetrahedron)this->dummypoint) {
    decode(this,searchtet->tet[3],searchtet);
    if (searchtet->tet[4] == pa_00) {
      searchtet->ver = 0xb;
    }
    else if (searchtet->tet[5] == pa_00) {
      searchtet->ver = 3;
    }
    else if (searchtet->tet[6] == pa_00) {
      searchtet->ver = 7;
    }
    else {
      searchtet->ver = 0;
    }
  }
  pc = dest(this,searchtet);
  if (pc != (point)neightet._8_8_) {
    pd = apex(this,searchtet);
    if (pd == (point)neightet._8_8_) {
      eprevesymself(this,searchtet);
    }
    else {
      while (pc_00 = oppo(this,searchtet), pc_00 != (point)neightet._8_8_) {
        if (pc_00 == this->dummypoint) {
          if (this->nonconvex != 0) {
            return ACROSSFACE;
          }
          terminatetetgen(this,2);
        }
        dVar4 = orient3d((double *)pa_00,pc,pd,(double *)neightet._8_8_);
        dVar5 = orient3d(pc,(double *)pa_00,pc_00,(double *)neightet._8_8_);
        dVar6 = orient3d((double *)pa_00,pd,pc_00,(double *)neightet._8_8_);
        if (dVar4 <= 0.0) {
          if (dVar5 <= 0.0) {
            if (dVar6 <= 0.0) {
              if ((dVar4 != 0.0) || (NAN(dVar4))) {
                if ((dVar5 == 0.0) && (!NAN(dVar5))) {
                  if ((dVar6 == 0.0) && (!NAN(dVar6))) {
                    esymself(this,searchtet);
                    enextself(this,searchtet);
                    return ACROSSVERT;
                  }
                  esymself(this,searchtet);
                  enextself(this,searchtet);
                  return ACROSSEDGE;
                }
                if ((dVar6 == 0.0) && (!NAN(dVar6))) {
                  eprevesymself(this,searchtet);
                  return ACROSSEDGE;
                }
                return ACROSSFACE;
              }
              if ((dVar5 == 0.0) && (!NAN(dVar5))) {
                return ACROSSVERT;
              }
              if ((dVar6 == 0.0) && (!NAN(dVar6))) {
                eprevesymself(this,searchtet);
                return ACROSSVERT;
              }
              return ACROSSEDGE;
            }
            cVar3 = '\x02';
          }
          else if (dVar6 <= 0.0) {
            cVar3 = '\x01';
          }
          else {
            uVar2 = randomnation(this,2);
            if (uVar2 == 0) {
              cVar3 = '\x02';
            }
            else {
              cVar3 = '\x01';
            }
          }
        }
        else if (dVar5 <= 0.0) {
          if (dVar6 <= 0.0) {
            cVar3 = '\0';
          }
          else {
            uVar2 = randomnation(this,2);
            if (uVar2 == 0) {
              cVar3 = '\x02';
            }
            else {
              cVar3 = '\0';
            }
          }
        }
        else if (dVar6 <= 0.0) {
          uVar2 = randomnation(this,2);
          cVar3 = uVar2 == 0;
        }
        else {
          uVar2 = randomnation(this,3);
          if ((int)uVar2 == 0) {
            cVar3 = '\0';
          }
          else if ((int)uVar2 == 1) {
            cVar3 = '\x01';
          }
          else {
            cVar3 = '\x02';
          }
        }
        if (cVar3 == '\x01') {
          iVar1 = searchtet->ver;
          decode(this,searchtet->tet[facepivot1[searchtet->ver]],searchtet);
          searchtet->ver = facepivot2[iVar1][searchtet->ver];
        }
        else if (cVar3 == '\x02') {
          eprevself(this,searchtet);
          iVar1 = searchtet->ver;
          decode(this,searchtet->tet[facepivot1[searchtet->ver]],searchtet);
          searchtet->ver = facepivot2[iVar1][searchtet->ver];
          enextself(this,searchtet);
        }
        else {
          iVar1 = searchtet->ver;
          decode(this,searchtet->tet[(int)(searchtet->ver & 3)],searchtet);
          searchtet->ver = fsymtbl[iVar1][searchtet->ver];
          enextself(this,searchtet);
        }
        pc = dest(this,searchtet);
        pd = apex(this,searchtet);
      }
      esymself(this,searchtet);
      enextself(this,searchtet);
    }
  }
  return ACROSSVERT;
}

Assistant:

enum tetgenmesh::interresult 
  tetgenmesh::finddirection(triface* searchtet, point endpt)
{
  triface neightet;
  point pa, pb, pc, pd;
  enum {HMOVE, RMOVE, LMOVE} nextmove;
  REAL hori, rori, lori;
  int t1ver;
  int s;

  // The origin is fixed.
  pa = org(*searchtet);
  if ((point) searchtet->tet[7] == dummypoint) {
    // A hull tet. Choose the neighbor of its base face.
    decode(searchtet->tet[3], *searchtet);
    // Reset the origin to be pa.
    if ((point) searchtet->tet[4] == pa) {
      searchtet->ver = 11;
    } else if ((point) searchtet->tet[5] == pa) {
      searchtet->ver = 3;
    } else if ((point) searchtet->tet[6] == pa) {
      searchtet->ver = 7;
    } else {
      searchtet->ver = 0;
    }
  }

  pb = dest(*searchtet);
  // Check whether the destination or apex is 'endpt'.
  if (pb == endpt) {
    // pa->pb is the search edge.
    return ACROSSVERT;
  }

  pc = apex(*searchtet);
  if (pc == endpt) {
    // pa->pc is the search edge.
    eprevesymself(*searchtet);
    return ACROSSVERT;
  }

  // Walk through tets around pa until the right one is found.
  while (1) {

    pd = oppo(*searchtet);
    // Check whether the opposite vertex is 'endpt'.
    if (pd == endpt) {
      // pa->pd is the search edge.
      esymself(*searchtet);
      enextself(*searchtet);
      return ACROSSVERT;
    }
    // Check if we have entered outside of the domain.
    if (pd == dummypoint) {
      // This is possible when the mesh is non-convex.
      if (nonconvex) {
        return ACROSSFACE; // return ACROSSSUB; // Hit a bounday.
      } else {
        terminatetetgen(this, 2);
      }
    }

    // Now assume that the base face abc coincides with the horizon plane,
    //   and d lies above the horizon.  The search point 'endpt' may lie
    //   above or below the horizon.  We test the orientations of 'endpt'
    //   with respect to three planes: abc (horizon), bad (right plane),
    //   and acd (left plane). 
    hori = orient3d(pa, pb, pc, endpt);
    rori = orient3d(pb, pa, pd, endpt);
    lori = orient3d(pa, pc, pd, endpt);

    // Now decide the tet to move.  It is possible there are more than one
    //   tets are viable moves. Is so, randomly choose one. 
    if (hori > 0) {
      if (rori > 0) {
        if (lori > 0) {
          // Any of the three neighbors is a viable move.
          s = randomnation(3); 
          if (s == 0) {
            nextmove = HMOVE;
          } else if (s == 1) {
            nextmove = RMOVE;
          } else {
            nextmove = LMOVE;
          }
        } else {
          // Two tets, below horizon and below right, are viable.
          if (randomnation(2)) {
            nextmove = HMOVE;
          } else {
            nextmove = RMOVE;
          }
        }
      } else {
        if (lori > 0) {
          // Two tets, below horizon and below left, are viable.
          if (randomnation(2)) {
            nextmove = HMOVE;
          } else {
            nextmove = LMOVE;
          }
        } else {
          // The tet below horizon is chosen.
          nextmove = HMOVE;
        }
      }
    } else {
      if (rori > 0) {
        if (lori > 0) {
          // Two tets, below right and below left, are viable.
          if (randomnation(2)) {
            nextmove = RMOVE;
          } else {
            nextmove = LMOVE;
          }
        } else {
          // The tet below right is chosen.
          nextmove = RMOVE;
        }
      } else {
        if (lori > 0) {
          // The tet below left is chosen.
          nextmove = LMOVE;
        } else {
          // 'endpt' lies either on the plane(s) or across face bcd.
          if (hori == 0) {
            if (rori == 0) {
              // pa->'endpt' is COLLINEAR with pa->pb.
              return ACROSSVERT;
            }
            if (lori == 0) {
              // pa->'endpt' is COLLINEAR with pa->pc.
              eprevesymself(*searchtet); // [a,c,d]
              return ACROSSVERT;
            }
            // pa->'endpt' crosses the edge pb->pc.
            return ACROSSEDGE;
          }
          if (rori == 0) {
            if (lori == 0) {
              // pa->'endpt' is COLLINEAR with pa->pd.
              esymself(*searchtet); // face bad.
              enextself(*searchtet); // face [a,d,b]
              return ACROSSVERT;
            }
            // pa->'endpt' crosses the edge pb->pd.
            esymself(*searchtet); // face bad.
            enextself(*searchtet); // face adb
            return ACROSSEDGE;
          }
          if (lori == 0) {
            // pa->'endpt' crosses the edge pc->pd.
            eprevesymself(*searchtet); // [a,c,d]
            return ACROSSEDGE;
          }
          // pa->'endpt' crosses the face bcd.
          return ACROSSFACE;
        }
      }
    }

    // Move to the next tet, fix pa as its origin.
    if (nextmove == RMOVE) {
      fnextself(*searchtet);
    } else if (nextmove == LMOVE) {
      eprevself(*searchtet);
      fnextself(*searchtet);
      enextself(*searchtet);
    } else { // HMOVE
      fsymself(*searchtet);
      enextself(*searchtet);
    }
    pb = dest(*searchtet);
    pc = apex(*searchtet);

  } // while (1)

}